

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int i;
  BxDFFlags BVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  byte bVar35;
  uint uVar36;
  bool bVar37;
  uint uVar38;
  TransportMode TVar39;
  TransportMode mode_00;
  code *this_00;
  ulong uVar40;
  uint64_t oldstate;
  long in_FS_OFFSET;
  undefined1 auVar41 [16];
  Float FVar42;
  float extraout_XMM0_Dc;
  ulong in_XMM0_Qb;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float extraout_XMM0_Db;
  float extraout_XMM0_Dd;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar69 [56];
  undefined1 auVar64 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar73 [16];
  undefined1 auVar89 [56];
  undefined1 auVar85 [64];
  ulong in_XMM2_Qb;
  undefined1 auVar90 [16];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 in_ZMM5 [64];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f VVar95;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  SampledSpectrum SVar96;
  Vector3f w;
  SampledSpectrum beta;
  Float g;
  optional<pbrt::BSDFSample> wis;
  Float f;
  optional<pbrt::PhaseFunctionSample> ps;
  Float pdf;
  optional<pbrt::BSDFSample> wos;
  Vector3f local_1f8;
  TransportMode TStack_1ec;
  undefined1 local_1e8 [4];
  float afStack_1e4 [6];
  ushort local_1ca;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_1a8;
  float local_198;
  float local_194;
  uint local_190;
  float local_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float afStack_170 [2];
  Vector3f local_168 [2];
  bool local_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  ulong local_138;
  ulong uStack_130;
  undefined1 local_128 [4];
  Vector3f VStack_124;
  Vector3f local_118 [2];
  bool local_fc;
  float local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint uStack_ec;
  undefined1 local_e8 [4];
  float afStack_e4 [3];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_d8;
  float local_c8;
  uint local_c4;
  uint local_c0;
  TransportMode local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ulong local_a8;
  ulong uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_78;
  undefined1 local_68 [8];
  float afStack_60 [9];
  bool local_3c;
  Vector3f wo_02;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar79 [16];
  
  uStack_f0 = 0;
  local_f8 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_138 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar64._4_60_ = wo._12_60_;
  auVar64._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_a8 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_88 = auVar64._0_16_;
  uStack_130 = in_XMM2_Qb;
  uStack_a0 = in_XMM0_Qb;
  if (((this->config).twoSided != '\0') && (auVar64._0_4_ < 0.0)) {
    local_88._0_8_ = CONCAT44(wo._12_4_,auVar64._0_4_) ^ 0x8000000080000000;
    local_88._8_4_ = wo._16_4_ ^ 0x80000000;
    local_88._12_4_ = wo._20_4_ ^ 0x80000000;
    local_f8 = -local_f8;
    in_XMM3_Db = in_XMM3_Db ^ 0x80000000;
    uStack_f0 = 0x80000000;
    in_XMM3_Dd = in_XMM3_Dd ^ 0x80000000;
    local_a8 = local_a8 ^ 0x8000000080000000;
    uStack_a0 = in_XMM0_Qb ^ 0x8000000080000000;
    local_138 = local_138 ^ 0x8000000080000000;
    uStack_130 = in_XMM2_Qb ^ 0x8000000080000000;
  }
  local_d8.bottom = (IdealDiffuseBxDF *)0x0;
  fVar93 = local_88._0_4_;
  local_1a8.bottom = &this->bottom;
  local_78.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)->top;
  if (0.0 < fVar93) {
    local_78.top = &this->top;
  }
  local_78.bottom = local_1a8.bottom;
  if (0.0 < fVar93) {
    local_78.bottom = local_d8.bottom;
  }
  bVar37 = 0.0 < local_f8 * fVar93 == 0.0 < fVar93;
  local_1a8.top = (DielectricInterfaceBxDF *)local_d8.bottom;
  local_d8.top = &this->top;
  if (bVar37) {
    local_d8.bottom = local_1a8.bottom;
    local_1a8.top = &this->top;
    local_1a8.bottom = (IdealDiffuseBxDF *)0x0;
    local_d8.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)->top
    ;
  }
  local_98 = ZEXT416((uint)this->thickness);
  _local_1b8 = ZEXT812(0);
  fStack_1ac = 0.0;
  uStack_f4 = in_XMM3_Db;
  uStack_ec = in_XMM3_Dd;
  if (0.0 < local_f8 * fVar93) {
    local_1b8._0_4_ = (undefined4)(this->config).nSamples;
    register0x000012c4 = in_ZMM5._4_12_;
    if (fVar93 <= 0.0) {
      auVar41._0_4_ =
           (((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)local_78.bottom)
           ->top).eta;
      auVar41._4_4_ =
           (((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)local_78.bottom)
           ->top).tint.values.values[0];
      auVar41._8_4_ =
           (((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)local_78.bottom)
           ->top).tint.values.values[1];
      auVar41._12_4_ =
           (((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)local_78.bottom)
           ->top).tint.values.values[2];
      auVar44._8_4_ = 0x3ea2f983;
      auVar44._0_8_ = 0x3ea2f9833ea2f983;
      auVar44._12_4_ = 0x3ea2f983;
      auVar44 = vmulps_avx512vl(auVar41,auVar44);
      auVar41 = vshufpd_avx(auVar44,auVar44,1);
    }
    else {
      VVar95.super_Tuple3<pbrt::Vector3,_float>.z = fVar93;
      VVar95.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
      VVar95.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
      auVar89 = ZEXT856(local_88._8_8_);
      auVar69 = ZEXT856(uStack_a0);
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
      SVar96 = DielectricInterfaceBxDF::f(local_78.top,VVar95,wi_00,mode);
      auVar84._0_8_ = SVar96.values.values._8_8_;
      auVar84._8_56_ = auVar89;
      auVar41 = auVar84._0_16_;
      auVar85._0_8_ = SVar96.values.values._0_8_;
      auVar85._8_56_ = auVar69;
      auVar44 = auVar85._0_16_;
    }
    fVar93 = local_1b8._0_4_;
    auVar41 = vunpcklpd_avx(auVar44,auVar41);
    local_1b8._4_4_ = auVar41._4_4_ * fVar93;
    local_1b8._0_4_ = auVar41._0_4_ * fVar93;
    fStack_1b0 = auVar41._8_4_ * fVar93;
    fStack_1ac = auVar41._12_4_ * fVar93;
  }
  fVar93 = 0.0;
  if ((this->config).nSamples != '\0') {
    uVar40 = local_a8 * -0x395b586ca42e166b;
    local_98._0_4_ = (uint)bVar37 * local_98._0_4_;
    uVar40 = (CONCAT44((int)(uVar40 >> 0x20),local_88._0_4_) ^
             ((uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b;
    uVar40 = (*Options & 0xffffff ^ uVar40 ^ 0x1a929e4d6f47a654 ^
             (uVar40 >> 0x2f | (ulong)(*Options & 0xff000000))) * -0x395b586ca42e166b;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b;
    lVar1 = (uVar40 >> 0x2f ^ uVar40) * 2 + 1;
    uVar6 = vcmpss_avx512f((undefined1  [16])0x0,local_88,1);
    local_1ca = (ushort)uVar6 & 1;
    uVar40 = (CONCAT44(0x4fb7dae8,local_f8) ^
             ((local_138 * -0x395b586ca42e166b >> 0x2f ^ local_138 * -0x395b586ca42e166b) *
              -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b
    ;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * 0x5851f42d4c957f2d + lVar1 * 0x5851f42d4c957f2e;
    uVar38 = 0;
    local_bc = (TransportMode)(mode == Radiance);
    TStack_1ec = mode;
    do {
      uVar36 = (uint)(uVar40 >> 0x2d) ^ (uint)(uVar40 >> 0x1b);
      bVar35 = (byte)(uVar40 >> 0x3b);
      auVar23._4_12_ = in_register_00001384;
      auVar23._0_4_ = in_XMM6_Da;
      auVar41 = vcvtusi2ss_avx512f(auVar23,uVar36 >> bVar35 | uVar36 << 0x20 - bVar35);
      uVar40 = uVar40 * 0x5851f42d4c957f2d + lVar1;
      auVar41 = vminss_avx(ZEXT416((uint)(auVar41._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      uVar32 = uVar40 * 0x5851f42d4c957f2d + lVar1;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar40;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar32;
      auVar44 = vpunpcklqdq_avx(auVar43,auVar70);
      auVar4 = vpsrlvq_avx2(auVar44,_DAT_003c5060);
      auVar5 = vpsrlvq_avx2(auVar44,_DAT_003c5070);
      auVar44 = vpsrlq_avx(auVar44,0x3b);
      auVar44 = vpshufd_avx(auVar44,0xe8);
      uVar40 = uVar32 * 0x5851f42d4c957f2d + lVar1;
      auVar4 = vpshufd_avx(auVar4 ^ auVar5,0xe8);
      auVar44 = vprorvd_avx512vl(auVar4,auVar44);
      auVar44 = vcvtudq2ps_avx512vl(auVar44);
      auVar4._8_4_ = 0x2f800000;
      auVar4._0_8_ = 0x2f8000002f800000;
      auVar4._12_4_ = 0x2f800000;
      auVar44 = vmulps_avx512vl(auVar44,auVar4);
      auVar5._8_4_ = 0x3f7fffff;
      auVar5._0_8_ = 0x3f7fffff3f7fffff;
      auVar5._12_4_ = 0x3f7fffff;
      auVar44 = vminps_avx512vl(auVar44,auVar5);
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_88._0_4_;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_a8;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_a8._4_4_;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                ((optional<pbrt::BSDFSample> *)local_68,&local_78,wo_00,auVar41._0_4_,
                 (Point2f)auVar44._0_8_,mode,Transmission);
      if (local_3c == true) {
        if (((float)local_68._0_4_ == 0.0) && (!NAN((float)local_68._0_4_))) {
          uVar32 = 0xffffffffffffffff;
          do {
            if (uVar32 == 2) goto LAB_003464df;
            pfVar3 = afStack_60 + uVar32;
            uVar32 = uVar32 + 1;
          } while ((*pfVar3 == 0.0) && (!NAN(*pfVar3)));
          if (2 < uVar32) goto LAB_003464df;
        }
        if (((afStack_60[5] != 0.0) || (NAN(afStack_60[5]))) &&
           ((afStack_60[4] != 0.0 || (NAN(afStack_60[4]))))) {
          auVar71._4_4_ = afStack_60[4];
          auVar71._0_4_ = afStack_60[4];
          auVar71._8_4_ = afStack_60[4];
          auVar71._12_4_ = afStack_60[4];
          auVar7._8_4_ = 0x7fffffff;
          auVar7._0_8_ = 0x7fffffff7fffffff;
          auVar7._12_4_ = 0x7fffffff;
          auVar41 = vandps_avx512vl(auVar71,auVar7);
          auVar45._4_4_ = afStack_60[5];
          auVar45._0_4_ = afStack_60[5];
          auVar45._8_4_ = afStack_60[5];
          auVar45._12_4_ = afStack_60[5];
          this_00 = (code *)&local_1a8;
          auVar72._0_4_ = auVar41._0_4_ * (float)local_68._0_4_;
          auVar72._4_4_ = auVar41._4_4_ * (float)local_68._4_4_;
          auVar72._8_4_ = auVar41._8_4_ * afStack_60[0];
          auVar72._12_4_ = auVar41._12_4_ * afStack_60[1];
          uVar32 = uVar40 * 0x5851f42d4c957f2d + lVar1;
          local_1f8.super_Tuple3<pbrt::Vector3,_float>.z = afStack_60[4];
          _local_1e8 = vdivps_avx(auVar72,auVar45);
          local_1f8.super_Tuple3<pbrt::Vector3,_float>.x = afStack_60[2];
          local_1f8.super_Tuple3<pbrt::Vector3,_float>.y = afStack_60[3];
          uVar36 = (uint)(uVar40 >> 0x2d) ^ (uint)(uVar40 >> 0x1b);
          bVar35 = (byte)(uVar40 >> 0x3b);
          local_188 = ZEXT416((uint)((byte)local_1ca & 1) * (int)this->thickness);
          local_18c = this->g;
          auVar24._4_12_ = in_register_00001384;
          auVar24._0_4_ = in_XMM6_Da;
          auVar41 = vcvtusi2ss_avx512f(auVar24,uVar36 >> bVar35 | uVar36 << 0x20 - bVar35);
          auVar41 = vminss_avx(ZEXT416((uint)(auVar41._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          uVar40 = uVar32 * 0x5851f42d4c957f2d + lVar1;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar32;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = uVar40;
          auVar44 = vpunpcklqdq_avx(auVar46,auVar73);
          auVar4 = vpsrlvq_avx2(auVar44,_DAT_003c5060);
          auVar5 = vpsrlvq_avx2(auVar44,_DAT_003c5070);
          auVar44 = vpsrlq_avx(auVar44,0x3b);
          auVar44 = vpshufd_avx(auVar44,0xe8);
          uVar40 = uVar40 * 0x5851f42d4c957f2d + lVar1;
          auVar4 = vpshufd_avx(auVar4 ^ auVar5,0xe8);
          auVar44 = vprorvd_avx512vl(auVar4,auVar44);
          auVar44 = vcvtudq2ps_avx512vl(auVar44);
          auVar8._8_4_ = 0x2f800000;
          auVar8._0_8_ = 0x2f8000002f800000;
          auVar8._12_4_ = 0x2f800000;
          auVar44 = vmulps_avx512vl(auVar44,auVar8);
          auVar9._8_4_ = 0x3f7fffff;
          auVar9._0_8_ = 0x3f7fffff3f7fffff;
          auVar9._12_4_ = 0x3f7fffff;
          auVar44 = vminps_avx512vl(auVar44,auVar9);
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                    ((optional<pbrt::BSDFSample> *)local_178,
                     (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                     this_00,wo_01,auVar41._0_4_,(Point2f)auVar44._0_8_,local_bc,Transmission);
          mode = TStack_1ec;
          if (local_14c == true) {
            if (((float)local_178._0_4_ == 0.0) && (!NAN((float)local_178._0_4_))) {
              uVar32 = 0xffffffffffffffff;
              do {
                if (uVar32 == 2) goto LAB_003464df;
                pfVar3 = afStack_170 + uVar32;
                uVar32 = uVar32 + 1;
              } while ((*pfVar3 == 0.0) && (!NAN(*pfVar3)));
              if (2 < uVar32) goto LAB_003464df;
            }
            if ((((local_168[1].super_Tuple3<pbrt::Vector3,_float>.x != 0.0) ||
                 (NAN(local_168[1].super_Tuple3<pbrt::Vector3,_float>.x))) &&
                ((local_168[0].super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                 (NAN(local_168[0].super_Tuple3<pbrt::Vector3,_float>.z))))) &&
               ((this->config).maxDepth != '\0')) {
              uVar36 = 0;
              local_194 = local_18c + local_18c;
              auVar44 = ZEXT416((uint)local_18c);
              auVar41 = vfmadd213ss_fma(auVar44,auVar44,SUB6416(ZEXT464(0x3f800000),0));
              auVar44 = vfnmadd213ss_fma(auVar44,auVar44,SUB6416(ZEXT464(0x3f800000),0));
              local_198 = auVar44._0_4_ * 0.07957747;
              local_190 = auVar41._0_4_;
              do {
                TVar39 = TStack_1ec;
                mode_00 = (TransportMode)this_00;
                local_c0 = uVar36;
                if (3 < uVar36) {
                  auVar64 = ZEXT464((uint)local_1e8);
                  lVar33 = 1;
                  auVar85 = ZEXT464((uint)local_1e8);
                  do {
                    lVar2 = lVar33 * 4;
                    lVar33 = lVar33 + 1;
                    auVar41 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar2)),auVar85._0_16_);
                    auVar85 = ZEXT1664(auVar41);
                  } while (lVar33 != 4);
                  if (auVar41._0_4_ < 0.25) {
                    lVar33 = 1;
                    do {
                      lVar2 = lVar33 * 4;
                      lVar33 = lVar33 + 1;
                      auVar41 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar2)),auVar64._0_16_);
                      auVar64 = ZEXT1664(auVar41);
                    } while (lVar33 != 4);
                    uVar36 = (uint)(uVar40 >> 0x2d) ^ (uint)(uVar40 >> 0x1b);
                    bVar35 = (byte)(uVar40 >> 0x3b);
                    uVar40 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar41 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar41._0_4_)),ZEXT416(0));
                    auVar25._4_12_ = in_register_00001384;
                    auVar25._0_4_ = in_XMM6_Da;
                    auVar44 = vcvtusi2ss_avx512f(auVar25,uVar36 >> bVar35 | uVar36 << 0x20 - bVar35)
                    ;
                    auVar44 = vminss_avx(ZEXT416((uint)(auVar44._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    mode = TStack_1ec;
                    if (auVar44._0_4_ < auVar41._0_4_) break;
                    fVar93 = 1.0 - auVar41._0_4_;
                    auVar47._4_4_ = fVar93;
                    auVar47._0_4_ = fVar93;
                    auVar47._8_4_ = fVar93;
                    auVar47._12_4_ = fVar93;
                    _local_1e8 = vdivps_avx(_local_1e8,auVar47);
                  }
                }
                fVar93 = (this->albedo).values.values[0];
                if ((fVar93 != 0.0) || (NAN(fVar93))) {
LAB_00346676:
                  uVar36 = (uint)(uVar40 >> 0x2d) ^ (uint)(uVar40 >> 0x1b);
                  bVar35 = (byte)(uVar40 >> 0x3b);
                  auVar26._4_12_ = in_register_00001384;
                  auVar26._0_4_ = in_XMM6_Da;
                  auVar41 = vcvtusi2ss_avx512f(auVar26,uVar36 >> bVar35 | uVar36 << 0x20 - bVar35);
                  auVar41 = vminss_avx(ZEXT416((uint)(auVar41._0_4_ * 2.3283064e-10)),
                                       ZEXT416(0x3f7fffff));
                  local_1c8 = ZEXT416((uint)local_1f8.super_Tuple3<pbrt::Vector3,_float>.z);
                  local_b8 = logf(1.0 - auVar41._0_4_);
                  auVar48._0_12_ = ZEXT412(0);
                  auVar48._12_4_ = 0;
                  uVar6 = vcmpss_avx512f(auVar48,ZEXT416((uint)local_1f8.
                                                               super_Tuple3<pbrt::Vector3,_float>.z)
                                         ,1);
                  local_148._0_2_ = (ushort)uVar6 & 1;
                  fStack_b4 = extraout_XMM0_Db;
                  fStack_b0 = extraout_XMM0_Dc;
                  fStack_ac = extraout_XMM0_Dd;
                  if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                       f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0'
                      ) && (iVar31 = __cxa_guard_acquire(&
                                                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>
                                                  ::
                                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                                  ::reg), iVar31 != 0)) {
                    this_00 = const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__;
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)
                               &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                                f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                                reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                               (PixelAccumFunc)0x0);
                    __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>
                                         ::
                                         f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                         ::reg);
                  }
                  mode_00 = (TransportMode)this_00;
                  *(long *)(in_FS_OFFSET + -0x188) = *(long *)(in_FS_OFFSET + -0x188) + 1;
                  auVar10._8_4_ = 0x7fffffff;
                  auVar10._0_8_ = 0x7fffffff7fffffff;
                  auVar10._12_4_ = 0x7fffffff;
                  auVar41 = vandps_avx512vl(local_1c8,auVar10);
                  uVar40 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                  fVar93 = -local_b8 / (1.0 / auVar41._0_4_);
                  fVar93 = (float)local_188._0_4_ +
                           (float)((uint)(local_148[0] & 1) * (int)fVar93 +
                                  (uint)!(bool)(local_148[0] & 1) * (int)-fVar93);
                  if (((float)local_188._0_4_ != fVar93) ||
                     (NAN((float)local_188._0_4_) || NAN(fVar93))) {
                    if ((fVar93 <= 0.0) || (this->thickness <= fVar93)) {
                      auVar41 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar93));
                      auVar54._0_12_ = ZEXT812(0);
                      auVar54._12_4_ = 0;
                      uVar6 = vcmpss_avx512f(ZEXT416((uint)fVar93),auVar54,1);
                      local_188._4_12_ = auVar41._4_12_;
                      local_188._0_4_ = (uint)!(bool)((byte)uVar6 & 1) * auVar41._0_4_;
                      TVar39 = TStack_1ec;
                      goto LAB_00346b90;
                    }
                    local_1c8._0_4_ = fVar93;
                    BVar30 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                             ::Flags(&local_1a8);
                    TVar39 = TStack_1ec;
                    auVar49 = SUB6416(ZEXT464(0x3f800000),0);
                    if ((BVar30 & Specular) == Unset) {
                      if (local_14c == false) goto LAB_0034743d;
                      auVar41 = vfmadd231ss_fma(ZEXT416((uint)(local_1f8.
                                                               super_Tuple3<pbrt::Vector3,_float>.y
                                                              * local_168[0].
                                                                super_Tuple3<pbrt::Vector3,_float>.y
                                                              )),
                                                ZEXT416((uint)local_1f8.
                                                              super_Tuple3<pbrt::Vector3,_float>.x),
                                                ZEXT416((uint)local_168[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.x))
                      ;
                      auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)local_1f8.
                                                                                                                                            
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                                ZEXT416((uint)local_168[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.z))
                      ;
                      auVar44 = vfmadd213ss_fma(auVar41,ZEXT416((uint)local_194),ZEXT416(local_190))
                      ;
                      auVar41 = vmaxss_avx(auVar44,ZEXT416(0));
                      auVar41 = vsqrtss_avx(auVar41,auVar41);
                      fVar93 = local_198 / (auVar44._0_4_ * auVar41._0_4_);
                      auVar49._0_4_ =
                           (local_168[1].super_Tuple3<pbrt::Vector3,_float>.x *
                           local_168[1].super_Tuple3<pbrt::Vector3,_float>.x) /
                           (local_168[1].super_Tuple3<pbrt::Vector3,_float>.x *
                            local_168[1].super_Tuple3<pbrt::Vector3,_float>.x + fVar93 * fVar93);
                      auVar49._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    }
                    _local_148 = auVar49;
                    if (local_14c == false) goto LAB_0034743d;
                    local_b8 = (this->albedo).values.values[0] * (float)local_1e8;
                    fStack_b4 = (this->albedo).values.values[1] * afStack_1e4[0];
                    fStack_b0 = (this->albedo).values.values[2] * afStack_1e4[1];
                    fStack_ac = (this->albedo).values.values[3] * afStack_1e4[2];
                    auVar41 = vfmadd231ss_fma(ZEXT416((uint)(local_1f8.
                                                             super_Tuple3<pbrt::Vector3,_float>.y *
                                                            local_168[0].
                                                            super_Tuple3<pbrt::Vector3,_float>.y)),
                                              ZEXT416((uint)local_1f8.
                                                            super_Tuple3<pbrt::Vector3,_float>.x),
                                              ZEXT416((uint)local_168[0].
                                                            super_Tuple3<pbrt::Vector3,_float>.x));
                    auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)local_1f8.
                                                                                                                                        
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                              ZEXT416((uint)local_168[0].
                                                            super_Tuple3<pbrt::Vector3,_float>.z));
                    local_c8 = (float)local_1c8._0_4_ - (float)local_98._0_4_;
                    local_c4 = auVar41._0_4_;
                    FVar42 = Tr(local_c8,local_168);
                    if (local_14c != true) goto LAB_0034743d;
                    auVar44 = vfmadd213ss_fma(ZEXT416(local_c4),ZEXT416((uint)local_194),
                                              ZEXT416(local_190));
                    auVar41 = vmaxss_avx(auVar44,ZEXT816(0));
                    auVar41 = vsqrtss_avx(auVar41,auVar41);
                    fVar93 = local_198 / (auVar44._0_4_ * auVar41._0_4_);
                    auVar50._0_4_ =
                         FVar42 * (float)local_148._0_4_ * fVar93 * local_b8 *
                         (float)local_178._0_4_;
                    auVar50._4_4_ =
                         FVar42 * (float)local_148._0_4_ * fVar93 * fStack_b4 *
                         (float)local_178._4_4_;
                    auVar50._8_4_ =
                         FVar42 * (float)local_148._0_4_ * fVar93 * fStack_b0 * afStack_170[0];
                    auVar50._12_4_ =
                         FVar42 * (float)local_148._0_4_ * fVar93 * fStack_ac * afStack_170[1];
                    auVar11._4_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar11._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar11._8_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar11._12_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    _local_148 = vdivps_avx512vl(auVar50,auVar11);
                    wo_02.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar51._0_8_ =
                         local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    auVar51._8_4_ = 0x80000000;
                    auVar51._12_4_ = 0x80000000;
                    uVar32 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = uVar40;
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar32;
                    auVar41 = vpunpcklqdq_avx(auVar90,auVar91);
                    auVar44 = vpsrlvq_avx2(auVar41,_DAT_003c5060);
                    auVar4 = vpsrlvq_avx2(auVar41,_DAT_003c5070);
                    auVar41 = vpsrlq_avx(auVar41,0x3b);
                    auVar41 = vpshufd_avx(auVar41,0xe8);
                    auVar44 = vpshufd_avx(auVar44 ^ auVar4,0xe8);
                    auVar41 = vprorvd_avx512vl(auVar44,auVar41);
                    auVar41 = vcvtudq2ps_avx512vl(auVar41);
                    auVar12._8_4_ = 0x2f800000;
                    auVar12._0_8_ = 0x2f8000002f800000;
                    auVar12._12_4_ = 0x2f800000;
                    auVar41 = vmulps_avx512vl(auVar41,auVar12);
                    auVar13._8_4_ = 0x3f7fffff;
                    auVar13._0_8_ = 0x3f7fffff3f7fffff;
                    auVar13._12_4_ = 0x3f7fffff;
                    auVar41 = vminps_avx512vl(auVar41,auVar13);
                    wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar51._0_8_;
                    wo_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar51._0_8_ >> 0x20)
                    ;
                    auVar69 = ZEXT856(auVar51._8_8_);
                    VVar95 = SampleHenyeyGreenstein
                                       (wo_02,local_18c,(Point2f)auVar41._0_8_,(Float *)local_e8);
                    VStack_124.super_Tuple3<pbrt::Vector3,_float>.z =
                         VVar95.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar65._0_8_ = VVar95.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar65._8_56_ = auVar69;
                    local_118[0].super_Tuple3<pbrt::Vector3,_float>.y =
                         (float)CONCAT31(local_118[0].super_Tuple3<pbrt::Vector3,_float>.y._1_3_,1);
                    local_1b8._4_4_ = (float)local_1b8._4_4_ + (float)local_148._4_4_;
                    local_1b8._0_4_ = (float)local_1b8._0_4_ + (float)local_148._0_4_;
                    fStack_1b0 = fStack_1b0 + fStack_140;
                    fStack_1ac = fStack_1ac + fStack_13c;
                    local_128 = local_e8;
                    uVar40 = vmovlps_avx(auVar65._0_16_);
                    VStack_124.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar40;
                    VStack_124.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar40 >> 0x20);
                    local_118[0].super_Tuple3<pbrt::Vector3,_float>.x = (float)local_e8;
                    auVar41 = local_188;
                    if ((((float)local_e8 != 0.0) || (NAN((float)local_e8))) &&
                       ((VStack_124.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                        (NAN(VStack_124.super_Tuple3<pbrt::Vector3,_float>.z))))) {
                      auVar52._4_4_ = local_e8;
                      auVar52._0_4_ = local_e8;
                      auVar52._8_4_ = local_e8;
                      auVar52._12_4_ = local_e8;
                      auVar74._0_4_ = (float)local_e8 * (this->albedo).values.values[0];
                      auVar74._4_4_ = (float)local_e8 * (this->albedo).values.values[1];
                      auVar74._8_4_ = (float)local_e8 * (this->albedo).values.values[2];
                      auVar74._12_4_ = (float)local_e8 * (this->albedo).values.values[3];
                      auVar41 = vdivps_avx(auVar74,auVar52);
                      afStack_1e4[0] = auVar41._4_4_ * afStack_1e4[0];
                      local_1e8 = (undefined1  [4])(auVar41._0_4_ * (float)local_1e8);
                      afStack_1e4[1] = auVar41._8_4_ * afStack_1e4[1];
                      afStack_1e4[2] = auVar41._12_4_ * afStack_1e4[2];
                      local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar40;
                      local_1f8.super_Tuple3<pbrt::Vector3,_float>.z =
                           VStack_124.super_Tuple3<pbrt::Vector3,_float>.z;
                      BVar30 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::Flags(&local_1a8);
                      if ((BVar30 & Specular) == Unset) {
                        auVar75._0_4_ = -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar75._4_4_ = 0x80000000;
                        auVar75._8_4_ = 0x80000000;
                        auVar75._12_4_ = 0x80000000;
                        auVar53._0_8_ =
                             local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        auVar53._8_4_ = 0x80000000;
                        auVar53._12_4_ = 0x80000000;
                        this_00 = (code *)(ulong)TVar39;
                        wo_03.super_Tuple3<pbrt::Vector3,_float>.z = auVar75._0_4_;
                        wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar53._0_8_;
                        wo_03.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)(auVar53._0_8_ >> 0x20);
                        auVar89 = ZEXT856(auVar75._8_8_);
                        auVar69 = ZEXT856(auVar53._8_8_);
                        wi_01.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                        wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                        wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                        SVar96 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                 ::f(&local_1a8,wo_03,wi_01,TVar39);
                        auVar86._0_8_ = SVar96.values.values._8_8_;
                        auVar86._8_56_ = auVar89;
                        auVar66._0_8_ = SVar96.values.values._0_8_;
                        auVar66._8_56_ = auVar69;
                        _local_e8 = vmovlhps_avx(auVar66._0_16_,auVar86._0_16_);
                        auVar41 = ZEXT416((uint)local_1c8._0_4_);
                        if ((SVar96.values.values[0] == 0.0) && (!NAN(SVar96.values.values[0]))) {
                          uVar40 = 0xffffffffffffffff;
                          do {
                            if (uVar40 == 2) goto LAB_0034732d;
                            lVar33 = uVar40 * 4;
                            uVar40 = uVar40 + 1;
                          } while ((*(float *)(local_e8 + lVar33 + 8) == 0.0) &&
                                  (!NAN(*(float *)(local_e8 + lVar33 + 8))));
                          if (2 < uVar40) goto LAB_0034732d;
                        }
                        if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                            local_1a8.top ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                            0x0) {
                          FVar42 = 0.0;
                        }
                        else {
                          wo_04.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                               0x8000000080000000;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                          FVar42 = DielectricInterfaceBxDF::PDF
                                             (local_1a8.top,wo_04,wi_02,(TransportMode)this_00,
                                              Transmission);
                        }
                        local_188._0_4_ = FVar42;
                        if (local_118[0].super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == '\0') {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x2c83e3c);
                        }
                        local_148._0_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.x;
                        FVar42 = Tr(local_c8,&VStack_124);
                        fVar93 = ((float)local_148._0_4_ * (float)local_148._0_4_) /
                                 ((float)local_188._0_4_ * (float)local_188._0_4_ +
                                 (float)local_148._0_4_ * (float)local_148._0_4_);
                        local_1b8._4_4_ =
                             fVar93 * FVar42 * afStack_1e4[0] * afStack_e4[0] +
                             (float)local_1b8._4_4_;
                        local_1b8._0_4_ =
                             fVar93 * FVar42 * (float)local_1e8 * (float)local_e8 +
                             (float)local_1b8._0_4_;
                        fStack_1b0 = fVar93 * FVar42 * afStack_1e4[1] * afStack_e4[1] + fStack_1b0;
                        fStack_1ac = fVar93 * FVar42 * afStack_1e4[2] * afStack_e4[2] + fStack_1ac;
                      }
                      auVar41 = ZEXT416((uint)local_1c8._0_4_);
                    }
LAB_0034732d:
                    uVar40 = uVar32 * 0x5851f42d4c957f2d + lVar1;
                    local_188 = auVar41;
                  }
                  else {
                    *(long *)(in_FS_OFFSET + -400) = *(long *)(in_FS_OFFSET + -400) + 1;
                  }
                }
                else {
                  uVar32 = 0;
                  do {
                    uVar34 = uVar32;
                    if (uVar34 == 3) goto LAB_00346797;
                    fVar93 = (this->albedo).values.values[uVar34 + 1];
                  } while ((fVar93 == 0.0) && (uVar32 = uVar34 + 1, !NAN(fVar93)));
                  if (uVar34 < 3) goto LAB_00346676;
LAB_00346797:
                  FVar42 = this->thickness;
                  uVar6 = vcmpss_avx512f(ZEXT416((uint)FVar42),ZEXT416((uint)local_188._0_4_),0);
                  local_188 = ZEXT416((uint)!(bool)((byte)uVar6 & 1) * (int)FVar42);
                  FVar42 = Tr(FVar42,&local_1f8);
                  afStack_1e4[0] = FVar42 * afStack_1e4[0];
                  local_1e8 = (undefined1  [4])(FVar42 * (float)local_1e8);
                  afStack_1e4[1] = FVar42 * afStack_1e4[1];
                  afStack_1e4[2] = FVar42 * afStack_1e4[2];
LAB_00346b90:
                  bVar35 = (byte)(uVar40 >> 0x38);
                  uVar36 = (uint)(uVar40 >> 0x20);
                  if ((local_188._0_4_ != (float)local_98._0_4_) ||
                     (NAN(local_188._0_4_) || NAN((float)local_98._0_4_))) {
                    BVar30 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                             ::Flags(&local_d8);
                    if ((BVar30 & Specular) == Unset) {
                      BVar30 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::Flags(&local_1a8);
                      if ((BVar30 & Specular) == Unset) {
                        if ((local_14c & 1U) == 0) goto LAB_0034743d;
                        if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                            local_d8.top ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                            0x0) {
                          auVar22._8_4_ = 0x7fffffff;
                          auVar22._0_8_ = 0x7fffffff7fffffff;
                          auVar22._12_4_ = 0x7fffffff;
                          auVar41 = vandps_avx512vl(ZEXT416((uint)local_168[0].
                                                                  super_Tuple3<pbrt::Vector3,_float>
                                                                  .z),auVar22);
                          uVar6 = vcmpss_avx512f(ZEXT416((uint)(local_1f8.
                                                                super_Tuple3<pbrt::Vector3,_float>.z
                                                               * local_168[0].
                                                                 super_Tuple3<pbrt::Vector3,_float>.
                                                                 z)),ZEXT416(0),0xe);
                          fVar93 = (float)((uint)((byte)uVar6 & 1) *
                                          (int)(auVar41._0_4_ * 0.31830987));
                          local_1c8._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                        }
                        else {
                          local_1c8._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                          wi_03.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_06.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                          wi_03.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               CONCAT44(local_168[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                        local_168[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                               0x8000000080000000;
                          wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                               0x8000000080000000;
                          fVar93 = DielectricInterfaceBxDF::PDF
                                             (local_d8.top,wo_06,wi_03,mode_00,All);
                        }
                        local_1c8 = ZEXT416((uint)(((float)local_1c8._0_4_ * (float)local_1c8._0_4_)
                                                  / ((float)local_1c8._0_4_ * (float)local_1c8._0_4_
                                                    + fVar93 * fVar93)));
                      }
                      else {
                        local_1c8 = SUB6416(ZEXT464(0x3f800000),0);
                      }
                      if ((local_14c & 1U) == 0) {
LAB_0034743d:
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x2c83e3c);
                      }
                      if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                          local_d8.top ==
                          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)
                      {
                        auVar79._0_12_ = ZEXT812(0);
                        auVar79._12_4_ = 0;
                        auVar57._0_12_ = ZEXT812(0);
                        auVar57._12_4_ = 0.0;
                        if (0.0 < local_1f8.super_Tuple3<pbrt::Vector3,_float>.z *
                                  local_168[0].super_Tuple3<pbrt::Vector3,_float>.z) {
                          auVar57._0_4_ =
                               ((DielectricInterfaceBxDF *)&(local_d8.bottom)->R)->eta * 0.31830987;
                          auVar57._4_4_ =
                               (((DielectricInterfaceBxDF *)&(local_d8.bottom)->R)->tint).values.
                               values[0] * 0.31830987;
                          auVar57._8_4_ =
                               (((DielectricInterfaceBxDF *)&(local_d8.bottom)->R)->tint).values.
                               values[1] * 0.31830987;
                          auVar57._12_4_ =
                               (((DielectricInterfaceBxDF *)&(local_d8.bottom)->R)->tint).values.
                               values[2] * 0.31830987;
                          auVar79 = vshufpd_avx(auVar57,auVar57,1);
                        }
                      }
                      else {
                        auVar56._0_8_ =
                             local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        auVar56._8_4_ = 0x80000000;
                        auVar56._12_4_ = 0x80000000;
                        auVar78._0_4_ = -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar78._4_4_ = 0x80000000;
                        auVar78._8_4_ = 0x80000000;
                        auVar78._12_4_ = 0x80000000;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(local_168[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                      local_168[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                             0x8000000080000000;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.z = auVar78._0_4_;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar56._0_8_;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)(auVar56._0_8_ >> 0x20);
                        auVar89 = ZEXT856(auVar78._8_8_);
                        auVar69 = ZEXT856(auVar56._8_8_);
                        SVar96 = DielectricInterfaceBxDF::f(local_d8.top,wo_07,wi_04,TVar39);
                        auVar87._0_8_ = SVar96.values.values._8_8_;
                        auVar87._8_56_ = auVar89;
                        auVar79 = auVar87._0_16_;
                        auVar67._0_8_ = SVar96.values.values._0_8_;
                        auVar67._8_56_ = auVar69;
                        auVar57 = auVar67._0_16_;
                      }
                      if (local_14c != true) goto LAB_0034743d;
                      auVar41 = vmovlhps_avx(auVar57,auVar79);
                      local_148._4_4_ = auVar41._4_4_ * afStack_1e4[0];
                      local_148._0_4_ = auVar41._0_4_ * (float)local_1e8;
                      fStack_140 = auVar41._8_4_ * afStack_1e4[1];
                      fStack_13c = auVar41._12_4_ * afStack_1e4[2];
                      local_b8 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_b4 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_b0 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_ac = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      FVar42 = Tr(this->thickness,local_168);
                      if (local_14c != true) goto LAB_0034743d;
                      auVar29._4_4_ = fStack_b4;
                      auVar29._0_4_ = local_b8;
                      auVar29._8_4_ = fStack_b0;
                      auVar29._12_4_ = fStack_ac;
                      auVar17._8_4_ = 0x7fffffff;
                      auVar17._0_8_ = 0x7fffffff7fffffff;
                      auVar17._12_4_ = 0x7fffffff;
                      auVar41 = vandps_avx512vl(auVar29,auVar17);
                      auVar58._0_4_ =
                           FVar42 * (float)local_1c8._0_4_ * auVar41._0_4_ * (float)local_148._0_4_
                           * (float)local_178._0_4_;
                      auVar58._4_4_ =
                           FVar42 * (float)local_1c8._0_4_ * auVar41._4_4_ * (float)local_148._4_4_
                           * (float)local_178._4_4_;
                      auVar58._8_4_ =
                           FVar42 * (float)local_1c8._0_4_ * auVar41._8_4_ * fStack_140 *
                           afStack_170[0];
                      auVar58._12_4_ =
                           FVar42 * (float)local_1c8._0_4_ * auVar41._12_4_ * fStack_13c *
                           afStack_170[1];
                      auVar18._4_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar18._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar18._8_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar18._12_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar41 = vdivps_avx512vl(auVar58,auVar18);
                      local_1b8._4_4_ = auVar41._4_4_ + (float)local_1b8._4_4_;
                      local_1b8._0_4_ = auVar41._0_4_ + (float)local_1b8._0_4_;
                      fStack_1b0 = auVar41._8_4_ + fStack_1b0;
                      fStack_1ac = auVar41._12_4_ + fStack_1ac;
                    }
                    uVar36 = uVar36 >> 0xd ^ (uint)(uVar40 >> 0x1b);
                    bVar35 = bVar35 >> 3;
                    auVar28._4_12_ = in_register_00001384;
                    auVar28._0_4_ = in_XMM6_Da;
                    auVar41 = vcvtusi2ss_avx512f(auVar28,uVar36 >> bVar35 | uVar36 << 0x20 - bVar35)
                    ;
                    uVar40 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar41 = vminss_avx(ZEXT416((uint)(auVar41._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    uVar32 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = uVar40;
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = uVar32;
                    auVar44 = vpunpcklqdq_avx(auVar59,auVar80);
                    auVar4 = vpsrlvq_avx2(auVar44,_DAT_003c5060);
                    auVar5 = vpsrlvq_avx2(auVar44,_DAT_003c5070);
                    auVar44 = vpsrlq_avx(auVar44,0x3b);
                    auVar44 = vpshufd_avx(auVar44,0xe8);
                    auVar4 = vpshufd_avx(auVar4 ^ auVar5,0xe8);
                    auVar44 = vprorvd_avx512vl(auVar4,auVar44);
                    auVar44 = vcvtudq2ps_avx512vl(auVar44);
                    auVar19._8_4_ = 0x2f800000;
                    auVar19._0_8_ = 0x2f8000002f800000;
                    auVar19._12_4_ = 0x2f800000;
                    auVar44 = vmulps_avx512vl(auVar44,auVar19);
                    auVar20._8_4_ = 0x3f7fffff;
                    auVar20._0_8_ = 0x3f7fffff3f7fffff;
                    auVar20._12_4_ = 0x3f7fffff;
                    auVar44 = vminps_avx512vl(auVar44,auVar20);
                    wo_08.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                    wo_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    this_00 = (code *)&local_d8;
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_128,
                               (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                *)this_00,wo_08,auVar41._0_4_,(Point2f)auVar44._0_8_,TStack_1ec,
                               Reflection);
                    uVar40 = uVar32 * 0x5851f42d4c957f2d + lVar1;
                    mode = TStack_1ec;
                    if (local_fc != true) break;
                    if (((float)local_128 == 0.0) && (!NAN((float)local_128))) {
                      uVar32 = 0xffffffffffffffff;
                      do {
                        if (uVar32 == 2) goto LAB_003464df;
                        fVar93 = (&VStack_124.super_Tuple3<pbrt::Vector3,_float>.y)[uVar32];
                        uVar32 = uVar32 + 1;
                      } while ((fVar93 == 0.0) && (!NAN(fVar93)));
                      if (2 < uVar32) break;
                    }
                    if (((local_118[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_118[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_118[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_118[0].super_Tuple3<pbrt::Vector3,_float>.z))))) break;
                    auVar81._4_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar81._0_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar81._8_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar81._12_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar21._8_4_ = 0x7fffffff;
                    auVar21._0_8_ = 0x7fffffff7fffffff;
                    auVar21._12_4_ = 0x7fffffff;
                    auVar41 = vandps_avx512vl(auVar81,auVar21);
                    auVar60._4_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar60._0_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar60._8_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar60._12_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar82._0_4_ = auVar41._0_4_ * (float)local_128;
                    auVar82._4_4_ = auVar41._4_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar82._8_4_ = auVar41._8_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar82._12_4_ =
                         auVar41._12_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.z;
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_118[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_118[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    auVar41 = vdivps_avx(auVar82,auVar60);
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    afStack_1e4[0] = auVar41._4_4_ * afStack_1e4[0];
                    local_1e8 = (undefined1  [4])(auVar41._0_4_ * (float)local_1e8);
                    afStack_1e4[1] = auVar41._8_4_ * afStack_1e4[1];
                    afStack_1e4[2] = auVar41._12_4_ * afStack_1e4[2];
                    BVar30 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                             ::Flags(&local_1a8);
                    if ((BVar30 & Specular) == Unset) {
                      this_00 = (code *)(ulong)TStack_1ec;
                      auVar83._0_4_ = -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar83._4_4_ = 0x80000000;
                      auVar83._8_4_ = 0x80000000;
                      auVar83._12_4_ = 0x80000000;
                      auVar69 = ZEXT856(auVar83._8_8_);
                      if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                          local_1a8.top ==
                          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)
                      {
                        auVar41 = ZEXT816(0) << 0x20;
                        auVar62._0_12_ = ZEXT812(0);
                        auVar62._12_4_ = 0.0;
                        if (0.0 < auVar83._0_4_ * local_f8) {
                          auVar62._0_4_ = ((local_1a8.bottom)->R).values.values[0] * 0.31830987;
                          auVar62._4_4_ = ((local_1a8.bottom)->R).values.values[1] * 0.31830987;
                          auVar62._8_4_ = ((local_1a8.bottom)->R).values.values[2] * 0.31830987;
                          auVar62._12_4_ = ((local_1a8.bottom)->R).values.values[3] * 0.31830987;
                          auVar41 = vshufpd_avx(auVar62,auVar62,1);
                        }
                      }
                      else {
                        auVar61._0_8_ =
                             local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        auVar61._8_4_ = 0x80000000;
                        auVar61._12_4_ = 0x80000000;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.z = auVar83._0_4_;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar61._0_8_;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)(auVar61._0_8_ >> 0x20);
                        auVar89 = ZEXT856(auVar61._8_8_);
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                        SVar96 = DielectricInterfaceBxDF::f(local_1a8.top,wo_09,wi_05,TStack_1ec);
                        auVar88._0_8_ = SVar96.values.values._8_8_;
                        auVar88._8_56_ = auVar69;
                        auVar41 = auVar88._0_16_;
                        auVar68._0_8_ = SVar96.values.values._0_8_;
                        auVar68._8_56_ = auVar89;
                        auVar62 = auVar68._0_16_;
                      }
                      _local_e8 = vmovlhps_avx(auVar62,auVar41);
                      if ((auVar62._0_4_ == 0.0) && (!NAN(auVar62._0_4_))) {
                        uVar32 = 0xffffffffffffffff;
                        do {
                          if (uVar32 == 2) goto LAB_003473b8;
                          lVar33 = uVar32 * 4;
                          uVar32 = uVar32 + 1;
                        } while ((*(float *)(local_e8 + lVar33 + 8) == 0.0) &&
                                (!NAN(*(float *)(local_e8 + lVar33 + 8))));
                        if (2 < uVar32) goto LAB_003473b8;
                      }
                      BVar30 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::Flags(&local_d8);
                      if ((BVar30 & Specular) == Unset) {
                        if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                            local_1a8.top ==
                            (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                            0x0) {
                          fVar93 = 0.0;
                        }
                        else {
                          wo_10.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                               0x8000000080000000;
                          wi_06.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                          wi_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_138;
                          wi_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_138._4_4_;
                          fVar93 = DielectricInterfaceBxDF::PDF
                                             (local_1a8.top,wo_10,wi_06,(TransportMode)this_00,
                                              Transmission);
                        }
                        if (local_fc == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x2c83e3c);
                        }
                        local_1c8 = ZEXT416((uint)((local_118[1].super_Tuple3<pbrt::Vector3,_float>.
                                                    x * local_118[1].
                                                        super_Tuple3<pbrt::Vector3,_float>.x) /
                                                  (fVar93 * fVar93 +
                                                  local_118[1].super_Tuple3<pbrt::Vector3,_float>.x
                                                  * local_118[1].super_Tuple3<pbrt::Vector3,_float>.
                                                    x)));
                      }
                      else {
                        local_1c8 = SUB6416(ZEXT464(0x3f800000),0);
                      }
                      if ((local_fc & 1U) == 0) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x2c83e3c);
                      }
                      FVar42 = Tr(this->thickness,local_118);
                      local_1b8._4_4_ =
                           (float)local_1c8._0_4_ * FVar42 * afStack_1e4[0] * afStack_e4[0] +
                           (float)local_1b8._4_4_;
                      local_1b8._0_4_ =
                           (float)local_1c8._0_4_ * FVar42 * (float)local_1e8 * (float)local_e8 +
                           (float)local_1b8._0_4_;
                      fStack_1b0 = (float)local_1c8._0_4_ * FVar42 * afStack_1e4[1] * afStack_e4[1]
                                   + fStack_1b0;
                      fStack_1ac = (float)local_1c8._0_4_ * FVar42 * afStack_1e4[2] * afStack_e4[2]
                                   + fStack_1ac;
                    }
                  }
                  else {
                    this_00 = (code *)&local_1a8;
                    uVar36 = uVar36 >> 0xd ^ (uint)(uVar40 >> 0x1b);
                    bVar35 = bVar35 >> 3;
                    auVar27._4_12_ = in_register_00001384;
                    auVar27._0_4_ = in_XMM6_Da;
                    auVar41 = vcvtusi2ss_avx512f(auVar27,uVar36 >> bVar35 | uVar36 << 0x20 - bVar35)
                    ;
                    uVar40 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar41 = vminss_avx(ZEXT416((uint)(auVar41._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    wo_05.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_1f8.super_Tuple3<pbrt::Vector3,_float>.z;
                    wo_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    uVar32 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = uVar40;
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = uVar32;
                    auVar44 = vpunpcklqdq_avx(auVar92,auVar94);
                    auVar4 = vpsrlvq_avx2(auVar44,_DAT_003c5060);
                    auVar5 = vpsrlvq_avx2(auVar44,_DAT_003c5070);
                    auVar44 = vpsrlq_avx(auVar44,0x3b);
                    auVar44 = vpshufd_avx(auVar44,0xe8);
                    uVar40 = uVar32 * 0x5851f42d4c957f2d + lVar1;
                    auVar4 = vpshufd_avx(auVar4 ^ auVar5,0xe8);
                    auVar44 = vprorvd_avx512vl(auVar4,auVar44);
                    auVar44 = vcvtudq2ps_avx512vl(auVar44);
                    auVar14._8_4_ = 0x2f800000;
                    auVar14._0_8_ = 0x2f8000002f800000;
                    auVar14._12_4_ = 0x2f800000;
                    auVar44 = vmulps_avx512vl(auVar44,auVar14);
                    auVar15._8_4_ = 0x3f7fffff;
                    auVar15._0_8_ = 0x3f7fffff3f7fffff;
                    auVar15._12_4_ = 0x3f7fffff;
                    auVar44 = vminps_avx512vl(auVar44,auVar15);
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_128,
                               (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                *)this_00,wo_05,auVar41._0_4_,(Point2f)auVar44._0_8_,TVar39,
                               Reflection);
                    mode = TStack_1ec;
                    if (local_fc != true) break;
                    if (((float)local_128 == 0.0) && (!NAN((float)local_128))) {
                      uVar32 = 0xffffffffffffffff;
                      do {
                        if (uVar32 == 2) goto LAB_003464df;
                        fVar93 = (&VStack_124.super_Tuple3<pbrt::Vector3,_float>.y)[uVar32];
                        uVar32 = uVar32 + 1;
                      } while ((fVar93 == 0.0) && (!NAN(fVar93)));
                      if (2 < uVar32) break;
                    }
                    if (((local_118[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_118[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_118[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_118[0].super_Tuple3<pbrt::Vector3,_float>.z))))) break;
                    auVar76._4_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar76._0_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar76._8_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar76._12_4_ = local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar16._8_4_ = 0x7fffffff;
                    auVar16._0_8_ = 0x7fffffff7fffffff;
                    auVar16._12_4_ = 0x7fffffff;
                    auVar41 = vandps_avx512vl(auVar76,auVar16);
                    auVar55._4_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar55._0_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar55._8_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar55._12_4_ = local_118[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar77._0_4_ = auVar41._0_4_ * (float)local_128;
                    auVar77._4_4_ = auVar41._4_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar77._8_4_ = auVar41._8_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar77._12_4_ =
                         auVar41._12_4_ * VStack_124.super_Tuple3<pbrt::Vector3,_float>.z;
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_118[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_118[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    auVar41 = vdivps_avx(auVar77,auVar55);
                    local_1f8.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_118[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    afStack_1e4[0] = auVar41._4_4_ * afStack_1e4[0];
                    local_1e8 = (undefined1  [4])(auVar41._0_4_ * (float)local_1e8);
                    afStack_1e4[1] = auVar41._8_4_ * afStack_1e4[1];
                    afStack_1e4[2] = auVar41._12_4_ * afStack_1e4[2];
                  }
                }
LAB_003473b8:
                uVar36 = local_c0 + 1;
                mode = TStack_1ec;
                if ((this->config).maxDepth <= uVar36) break;
              } while( true );
            }
          }
        }
      }
LAB_003464df:
      bVar35 = (this->config).nSamples;
      uVar38 = uVar38 + 1;
    } while (uVar38 < bVar35);
    fVar93 = (float)bVar35;
  }
  auVar63._4_4_ = fVar93;
  auVar63._0_4_ = fVar93;
  auVar63._8_4_ = fVar93;
  auVar63._12_4_ = fVar93;
  auVar41 = vdivps_avx(_local_1b8,auVar63);
  auVar44 = vshufpd_avx(auVar41,auVar41,1);
  SVar96.values.values._0_8_ = auVar41._0_8_;
  SVar96.values.values._8_8_ = auVar44._0_8_;
  return (SampledSpectrum)SVar96.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Estimate _LayeredBxDF_ value _f_ using random sampling
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance interface for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface;
        bool enteredTop = wo.z > 0;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;

        // Determine exit interface and exit $z$ for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> exitInterface, nonExitInterface;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            pstd::optional<BSDFSample> wos = enterInterface.Sample_f(
                wo, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Transmission);
            if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos->f * AbsCosTheta(wos->wi) / wos->pdf;
            Vector3f w = wos->wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            pstd::optional<BSDFSample> wis = exitInterface.Sample_f(
                wi, uc, Point2f(r(), r()), !mode, BxDFReflTransFlags::Transmission);
            if (!wis || !wis->f || wis->pdf == 0 || wis->wi.z == 0)
                continue;

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < 0.25f) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                // Account for media between layers and possibly scatter
                if (!albedo) {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);

                } else {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / std::abs(w.z));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1, phase.PDF(-w, -wis->wi));
                        f += beta * albedo * phase.p(-w, -wis->wi) * wt *
                             Tr(zp - exitZ, wis->wi) * wis->f / wis->pdf;

                        // Sample phase function and update layered path state
                        pstd::optional<PhaseFunctionSample> ps =
                            phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps->pdf == 0 || ps->wi.z == 0)
                            continue;
                        beta *= albedo * ps->p / ps->pdf;
                        w = ps->wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps->pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps->wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);
                }

                // Account for scattering at appropriate interface
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    pstd::optional<BSDFSample> bs = exitInterface.Sample_f(
                        -w, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1,
                                                nonExitInterface.PDF(-w, -wis->wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis->wi, mode) *
                             AbsCosTheta(wis->wi) * wt * Tr(thickness, wis->wi) * wis->f /
                             wis->pdf;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    pstd::optional<BSDFSample> bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs->pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs->wi) * fExit * wt;
                        }
                    }
                }
            }
        }

        return f / config.nSamples;
    }